

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::SerializeStruct(Parser *this,StructDef *struct_def,Value *val)

{
  int iVar1;
  uint uVar2;
  uoffset_t off_00;
  char *s;
  size_type sVar3;
  reference bytes;
  uint off;
  Value *val_local;
  StructDef *struct_def_local;
  Parser *this_local;
  
  s = (char *)std::__cxx11::string::c_str();
  uVar2 = atot<unsigned_int>(s);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->struct_stack_);
  if (sVar3 - uVar2 == struct_def->bytesize) {
    FlatBufferBuilder::Align(&this->builder_,struct_def->minalign);
    bytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (&this->struct_stack_,(ulong)uVar2);
    FlatBufferBuilder::PushBytes(&this->builder_,bytes,struct_def->bytesize);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->struct_stack_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->struct_stack_,sVar3 - struct_def->bytesize);
    iVar1 = val->offset;
    off_00 = FlatBufferBuilder::GetSize(&this->builder_);
    FlatBufferBuilder::AddStructOffset(&this->builder_,(voffset_t)iVar1,off_00);
    return;
  }
  __assert_fail("struct_stack_.size() - off == struct_def.bytesize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                ,0x16f,"void flatbuffers::Parser::SerializeStruct(const StructDef &, const Value &)"
               );
}

Assistant:

void Parser::SerializeStruct(const StructDef &struct_def, const Value &val) {
  auto off = atot<uoffset_t>(val.constant.c_str());
  assert(struct_stack_.size() - off == struct_def.bytesize);
  builder_.Align(struct_def.minalign);
  builder_.PushBytes(&struct_stack_[off], struct_def.bytesize);
  struct_stack_.resize(struct_stack_.size() - struct_def.bytesize);
  builder_.AddStructOffset(val.offset, builder_.GetSize());
}